

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void BM_vlog(int n)

{
  ostream *poVar1;
  bool local_8d;
  LogMessage local_78;
  LogMessageVoidify local_12;
  bool local_11;
  undefined4 local_10;
  int local_c;
  int32 verbose_level__;
  int n_local;
  
  local_c = n;
  while (0 < local_c) {
    local_10 = 1;
    if (BM_vlog::vlocal__.level == (int32 *)0x0) {
      local_c = local_c + -1;
      local_8d = google::InitVLOG3__(&BM_vlog::vlocal__,&fLI::FLAGS_v,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                     ,1);
    }
    else {
      local_8d = 0 < *BM_vlog::vlocal__.level;
      local_c = local_c + -1;
    }
    local_11 = local_8d;
    if (local_8d != false) {
      google::LogMessageVoidify::LogMessageVoidify(&local_12);
      google::LogMessage::LogMessage
                (&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0xb6);
      poVar1 = google::LogMessage::stream(&local_78);
      poVar1 = std::operator<<(poVar1,"test message");
      google::LogMessageVoidify::operator&(&local_12,poVar1);
      google::LogMessage::~LogMessage(&local_78);
    }
  }
  return;
}

Assistant:

static void BM_vlog(int n) {
  while (n-- > 0) {
    VLOG(1) << "test message";
  }
}